

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

void __thiscall
matchit::impl::IdBlockBase<mathiu::impl::Product>::reset
          (IdBlockBase<mathiu::impl::Product> *this,int32_t depth)

{
  variant<std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>
  local_50;
  int32_t local_14;
  IdBlockBase<mathiu::impl::Product> *pIStack_10;
  int32_t depth_local;
  IdBlockBase<mathiu::impl::Product> *this_local;
  
  if (-1 < this->mDepth - depth) {
    local_14 = depth;
    pIStack_10 = this;
    memset(&local_50,0,0x38);
    std::
    variant<std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>
    ::variant(&local_50);
    std::
    variant<std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>
    ::operator=(&this->mVariant,&local_50);
    std::
    variant<std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>
    ::~variant(&local_50);
    this->mDepth = local_14;
  }
  return;
}

Assistant:

constexpr void reset(int32_t depth)
            {
                if (mDepth - depth >= 0)
                {
                    mVariant = {};
                    mDepth = depth;
                }
            }